

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# positional_argument_test.cpp
# Opt level: O0

void testSinglePositionalArgument_NoOtherArguments_ShouldSucceed(void)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  __type _Var1;
  ArgumentVector ps;
  Argengine ae;
  size_type in_stack_fffffffffffffe88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe90;
  anon_class_8_1_3fcf66c1 *in_stack_fffffffffffffe98;
  function<void_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
  *in_stack_fffffffffffffea0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  allocator_type *in_stack_fffffffffffffeb8;
  allocator<char> *in_stack_fffffffffffffec0;
  iterator in_stack_fffffffffffffec8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  undefined1 *puVar2;
  string *local_118;
  undefined1 local_c8 [58];
  undefined1 local_8e;
  allocator<char> local_8d [20];
  allocator<char> local_79;
  string *local_78;
  string local_70 [32];
  undefined1 local_50 [32];
  string *local_30;
  undefined8 local_28;
  undefined1 local_20 [24];
  Argengine local_8 [8];
  
  local_8e = 1;
  local_78 = local_70;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffed0,(char *)in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  local_78 = (string *)local_50;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffed0,(char *)in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  local_8e = 0;
  local_30 = local_70;
  local_28 = 2;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x1074ff);
  __l._M_len = (size_type)in_stack_fffffffffffffed0;
  __l._M_array = in_stack_fffffffffffffec8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffffec0,__l,in_stack_fffffffffffffeb8);
  juzzlin::Argengine::Argengine(local_8,local_20,1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffea0);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x107559);
  local_118 = (string *)&local_30;
  do {
    local_118 = local_118 + -0x20;
    std::__cxx11::string::~string(local_118);
  } while (local_118 != local_70);
  std::allocator<char>::~allocator(local_8d);
  std::allocator<char>::~allocator(&local_79);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1075c2);
  puVar2 = local_c8;
  std::function<void(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)>::
  function<testSinglePositionalArgument_NoOtherArguments_ShouldSucceed()::__0,void>
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  juzzlin::Argengine::setPositionalArgumentCallback(local_8,puVar2);
  std::
  function<void_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
  ::~function((function<void_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
               *)0x10760a);
  juzzlin::Argengine::parse();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::at(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  juzzlin::Argengine::arguments_abi_cxx11_();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::at(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  _Var1 = std::operator==(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  if (!_Var1) {
    __assert_fail("ps.at(0) == ae.arguments().at(1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/juzzlin[P]Argengine/src/tests/positional_argument_test/positional_argument_test.cpp"
                  ,0x2e,"void testSinglePositionalArgument_NoOtherArguments_ShouldSucceed()");
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffea0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffea0);
  juzzlin::Argengine::~Argengine(local_8);
  return;
}

Assistant:

void testSinglePositionalArgument_NoOtherArguments_ShouldSucceed()
{
    Argengine ae({ "test", "a" });
    Argengine::ArgumentVector ps;
    ae.setPositionalArgumentCallback([&](Argengine::ArgumentVector args) {
        ps = args;
    });
    ae.parse();
    assert(ps.at(0) == ae.arguments().at(1));
}